

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportingbase.cpp
# Opt level: O0

void __thiscall trun::ResultsReportPinterBase::Begin(ResultsReportPinterBase *this)

{
  bool bVar1;
  Config *pCVar2;
  char *pcVar3;
  FILE *pFVar4;
  ResultsReportPinterBase *this_local;
  
  pCVar2 = Config::Instance();
  bVar1 = std::operator==(&pCVar2->reportFile,"-");
  if (bVar1) {
    this->fout = _stdout;
  }
  else {
    pCVar2 = Config::Instance();
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&pCVar2->reportFile);
    pFVar4 = fopen(pcVar3,"w+");
    this->fout = (FILE *)pFVar4;
    pFVar4 = _stderr;
    if (this->fout == (FILE *)0x0) {
      pCVar2 = Config::Instance();
      pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(&pCVar2->reportFile);
      fprintf(pFVar4,"Err: unable to create report file \'%s\'\n",pcVar3);
      this->fout = _stdout;
    }
  }
  return;
}

Assistant:

void ResultsReportPinterBase::Begin() {
    if (Config::Instance().reportFile == "-") {
        fout = stdout;
    } else {
#ifndef TRUN_EMBEDDED_MCU
        fout = fopen(Config::Instance().reportFile.c_str(), "w+");
        if (fout == nullptr) {
            fprintf(stderr, "Err: unable to create report file '%s'\n", Config::Instance().reportFile.c_str());
            fout = stdout;
        }
#else
        fout = stdout;
#endif
    }
}